

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall
Json::BuiltStyledStreamWriter::isMultineArray(BuiltStyledStreamWriter *this,Value *value)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  ArrayIndex AVar4;
  ArrayIndex AVar5;
  Value *pVVar6;
  long lVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  
  AVar4 = Value::size(value);
  bVar1 = this->rightMargin_ <= (int)(AVar4 * 3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->childValues_);
  if (0 < (int)AVar4 && !bVar1) {
    iVar8 = 1;
    do {
      pVVar6 = Value::operator[](value,iVar8 + -1);
      bVar1 = Value::isArray(pVVar6);
      if (bVar1) {
LAB_00129f81:
        AVar5 = Value::size(pVVar6);
        bVar1 = AVar5 != 0;
      }
      else {
        bVar1 = Value::isObject(pVVar6);
        if (bVar1) goto LAB_00129f81;
        bVar1 = false;
      }
    } while ((iVar8 < (int)AVar4) && (iVar8 = iVar8 + 1, !bVar1));
  }
  bVar3 = true;
  if (!bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(long)(int)AVar4);
    bVar2 = this->field_0xd8 | 1;
    this->field_0xd8 = bVar2;
    iVar8 = AVar4 * 2 + 2;
    if ((int)AVar4 < 1) {
      bVar9 = 0;
    }
    else {
      lVar7 = 8;
      uVar10 = 0;
      bVar9 = 0;
      do {
        pVVar6 = Value::operator[](value,(int)uVar10);
        bVar1 = hasCommentForValue(pVVar6);
        bVar9 = bVar9 | bVar1;
        pVVar6 = Value::operator[](value,(int)uVar10);
        writeValue(this,pVVar6);
        iVar8 = iVar8 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar10 = uVar10 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar4 != uVar10);
      bVar2 = this->field_0xd8;
    }
    this->field_0xd8 = bVar2 & 0xfe;
    bVar3 = (bool)(this->rightMargin_ <= iVar8 | bVar9);
  }
  return bVar3;
}

Assistant:

bool BuiltStyledStreamWriter::isMultineArray(Value const& value) {
  int size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (int index = 0; index < size && !isMultiLine; ++index) {
    Value const& childValue = value[index];
    isMultiLine =
        isMultiLine || ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    int lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (int index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += int(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}